

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O0

application * __thiscall
cppcms::application_specific_pool::get_new(application_specific_pool *this,service *srv)

{
  undefined8 in_RSI;
  long *in_RDI;
  application *a;
  enable_shared_from_this<cppcms::application_specific_pool> *in_stack_ffffffffffffff88;
  application *this_00;
  undefined1 local_40 [56];
  application *local_8;
  
  local_40._32_8_ = (**(code **)(*in_RDI + 0x10))(in_RDI,in_RSI);
  if ((application *)local_40._32_8_ == (application *)0x0) {
    local_8 = (application *)0x0;
  }
  else {
    this_00 = (application *)local_40;
    std::enable_shared_from_this<cppcms::application_specific_pool>::shared_from_this
              (in_stack_ffffffffffffff88);
    std::weak_ptr<cppcms::application_specific_pool>::
    weak_ptr<cppcms::application_specific_pool,void>
              ((weak_ptr<cppcms::application_specific_pool> *)this_00,
               (shared_ptr<cppcms::application_specific_pool> *)in_stack_ffffffffffffff88);
    application::set_pool(this_00,&in_stack_ffffffffffffff88->_M_weak_this);
    std::weak_ptr<cppcms::application_specific_pool>::~weak_ptr
              ((weak_ptr<cppcms::application_specific_pool> *)0x3a9c8f);
    std::shared_ptr<cppcms::application_specific_pool>::~shared_ptr
              ((shared_ptr<cppcms::application_specific_pool> *)0x3a9c99);
    local_8 = (application *)local_40._32_8_;
  }
  return local_8;
}

Assistant:

application *application_specific_pool::get_new(service &srv)
{
	application *a = new_application(srv);
	if(!a)
		return 0;
	a->set_pool(shared_from_this());
	return a;
}